

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  GetterXsYs<double> *pGVar6;
  TransformerLinLog *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  uint *puVar10;
  ImVec2 IVar11;
  double dVar12;
  ImVec2 IVar13;
  ImPlotContext *pIVar14;
  ImPlotContext *pIVar15;
  uint uVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  pIVar14 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar5 = pGVar6->Count;
  lVar17 = (long)(((pGVar6->Offset + prim + 1) % iVar5 + iVar5) % iVar5) * (long)pGVar6->Stride;
  dVar3 = *(double *)((long)pGVar6->Xs + lVar17);
  dVar12 = log10(*(double *)((long)pGVar6->Ys + lVar17) /
                 GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  pIVar15 = GImPlot;
  iVar5 = pTVar7->YAxis;
  pIVar8 = pIVar14->CurrentPlot;
  dVar4 = pIVar8->YAxis[iVar5].Range.Min;
  fVar21 = (float)((dVar3 - (pIVar8->XAxis).Range.Min) * pIVar14->Mx +
                  (double)pIVar14->PixelRange[iVar5].Min.x);
  fVar19 = (float)((((double)(float)(dVar12 / pIVar14->LogDenY[iVar5]) *
                     (pIVar8->YAxis[iVar5].Range.Max - dVar4) + dVar4) - dVar4) * pIVar14->My[iVar5]
                  + (double)pIVar14->PixelRange[iVar5].Min.y);
  pGVar6 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar5 = pGVar6->Count;
  lVar17 = (long)(((prim + 1 + pGVar6->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar6->Stride;
  dVar3 = *(double *)((long)pGVar6->Xs + lVar17);
  dVar12 = log10(*(double *)((long)pGVar6->Ys + lVar17) /
                 GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  iVar5 = pTVar7->YAxis;
  pIVar8 = pIVar15->CurrentPlot;
  dVar4 = pIVar8->YAxis[iVar5].Range.Min;
  fVar18 = (float)((dVar3 - (pIVar8->XAxis).Range.Min) * pIVar15->Mx +
                  (double)pIVar15->PixelRange[iVar5].Min.x);
  fVar23 = (float)((((double)(float)(dVar12 / pIVar15->LogDenY[iVar5]) *
                     (pIVar8->YAxis[iVar5].Range.Max - dVar4) + dVar4) - dVar4) * pIVar15->My[iVar5]
                  + (double)pIVar15->PixelRange[iVar5].Min.y);
  fVar20 = (this->P12).x;
  fVar22 = fVar20 - fVar18;
  fVar25 = (this->P11).x;
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar26 = fVar25 * fVar19 - fVar21 * fVar1;
  fVar20 = fVar20 * fVar23 - fVar18 * fVar2;
  fVar25 = fVar25 - fVar21;
  fVar24 = fVar25 * (fVar2 - fVar23) - fVar22 * (fVar1 - fVar19);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9->col = this->Col;
  pIVar9[1].pos.x = fVar21;
  pIVar9[1].pos.y = fVar19;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[1].col = this->Col;
  IVar13.y = ((fVar2 - fVar23) * fVar26 - (fVar1 - fVar19) * fVar20) / fVar24;
  IVar13.x = (fVar26 * fVar22 - fVar25 * fVar20) / fVar24;
  pIVar9[2].pos = IVar13;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[2].col = this->Col;
  pIVar9[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[3].col = this->Col;
  IVar11.y = fVar23;
  IVar11.x = fVar18;
  pIVar9[4].pos = IVar11;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar9 + 5;
  puVar10 = DrawList->_IdxWritePtr;
  *puVar10 = DrawList->_VtxCurrentIdx;
  uVar16 = -(uint)(fVar2 < fVar1 && fVar19 < fVar23 || fVar1 < fVar2 && fVar23 < fVar19) & 1;
  puVar10[1] = DrawList->_VtxCurrentIdx + uVar16 + 1;
  puVar10[2] = DrawList->_VtxCurrentIdx + 3;
  puVar10[3] = DrawList->_VtxCurrentIdx + 1;
  puVar10[4] = (uVar16 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar10[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar10 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar21;
  (this->P11).y = fVar19;
  (this->P12).x = fVar18;
  (this->P12).y = fVar23;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }